

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

int Fraig_HashTableLookupS
              (Fraig_Man_t *pMan,Fraig_Node_t *p1,Fraig_Node_t *p2,Fraig_Node_t **ppNodeRes)

{
  uint uVar1;
  Fraig_HashTable_t *pFVar2;
  Fraig_Node_t *pFVar3;
  int iVar4;
  Fraig_Node_t **ppFVar5;
  ulong uVar6;
  Fraig_Node_t *pFVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  Fraig_Node_t *pFVar11;
  Fraig_Node_t *pFVar12;
  ulong uVar13;
  ulong uVar14;
  
  pFVar7 = p1;
  if (*(int *)((ulong)p2 & 0xfffffffffffffffe) < *(int *)((ulong)p1 & 0xfffffffffffffffe)) {
    pFVar7 = p2;
    p2 = p1;
  }
  pFVar2 = pMan->pTableS;
  uVar10 = (long)p2 * 0xc00005 + (long)pFVar7;
  iVar4 = pFVar2->nBins;
  uVar13 = uVar10 % (ulong)(long)iVar4 & 0xffffffff;
  ppFVar5 = pFVar2->pBins + uVar13;
  while (pFVar11 = *ppFVar5, pFVar11 != (Fraig_Node_t *)0x0) {
    if ((pFVar11->p1 == pFVar7) && (pFVar11->p2 == p2)) {
      *ppNodeRes = pFVar11;
      return 1;
    }
    ppFVar5 = &pFVar11->pNextS;
  }
  if (SBORROW4(pFVar2->nEntries,iVar4 * 2) == pFVar2->nEntries + iVar4 * -2 < 0) {
    Abc_Clock();
    uVar1 = pFVar2->nBins;
    iVar4 = Abc_PrimeCudd(uVar1 * 2);
    uVar14 = (ulong)iVar4;
    ppFVar5 = (Fraig_Node_t **)calloc(1,uVar14 * 8);
    uVar8 = 0;
    uVar13 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar13 = uVar8;
    }
    iVar9 = 0;
    for (; uVar8 != uVar13; uVar8 = uVar8 + 1) {
      pFVar11 = pFVar2->pBins[uVar8];
      if (pFVar11 != (Fraig_Node_t *)0x0) goto LAB_00551652;
      pFVar3 = (Fraig_Node_t *)0x0;
      pFVar12 = pFVar11;
      while (pFVar11 = pFVar3, pFVar12 != (Fraig_Node_t *)0x0) {
        uVar6 = (ulong)((long)pFVar12->p2 * 0xc00005 + (long)pFVar12->p1) % uVar14 & 0xffffffff;
        pFVar12->pNextS = ppFVar5[uVar6];
        ppFVar5[uVar6] = pFVar12;
        iVar9 = iVar9 + 1;
        pFVar3 = (Fraig_Node_t *)0x0;
        pFVar12 = pFVar11;
        if (pFVar11 != (Fraig_Node_t *)0x0) {
LAB_00551652:
          pFVar3 = pFVar11->pNextS;
          pFVar12 = pFVar11;
        }
      }
    }
    if (iVar9 != pFVar2->nEntries) {
      __assert_fail("Counter == p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigTable.c"
                    ,0x11b,"void Fraig_TableResizeS(Fraig_HashTable_t *)");
    }
    free(pFVar2->pBins);
    pFVar2->pBins = ppFVar5;
    pFVar2->nBins = iVar4;
    uVar13 = uVar10 % uVar14 & 0xffffffff;
  }
  pFVar7 = Fraig_NodeCreate(pMan,pFVar7,p2);
  ppFVar5 = pFVar2->pBins;
  pFVar7->pNextS = ppFVar5[uVar13];
  ppFVar5[uVar13] = pFVar7;
  *ppNodeRes = pFVar7;
  pFVar2->nEntries = pFVar2->nEntries + 1;
  return 0;
}

Assistant:

int Fraig_HashTableLookupS( Fraig_Man_t * pMan, Fraig_Node_t * p1, Fraig_Node_t * p2, Fraig_Node_t ** ppNodeRes )
{
    Fraig_HashTable_t * p = pMan->pTableS;
    Fraig_Node_t * pEnt;
    unsigned Key;

    // order the arguments
    if ( Fraig_Regular(p1)->Num > Fraig_Regular(p2)->Num )
        pEnt = p1, p1 = p2, p2 = pEnt;

    Key = Fraig_HashKey2( p1, p2, p->nBins );
    Fraig_TableBinForEachEntryS( p->pBins[Key], pEnt )
        if ( pEnt->p1 == p1 && pEnt->p2 == p2 )
        {
            *ppNodeRes = pEnt;
            return 1;
        }
    // check if it is a good time for table resizing
    if ( p->nEntries >= 2 * p->nBins )
    {
        Fraig_TableResizeS( p );
        Key = Fraig_HashKey2( p1, p2, p->nBins );
    }
    // create the new node
    pEnt = Fraig_NodeCreate( pMan, p1, p2 );
    // add the node to the corresponding linked list in the table
    pEnt->pNextS = p->pBins[Key];
    p->pBins[Key] = pEnt;
    *ppNodeRes = pEnt;
    p->nEntries++;
    return 0;
}